

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O0

string * __thiscall
QPDF_String::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDF_String *this,bool force_binary)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  int in_R8D;
  bool local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_51;
  uint local_50;
  char ch;
  uint i;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  bool use_hexstring;
  bool force_binary_local;
  QPDF_String *this_local;
  string *result;
  
  local_99 = true;
  if (!force_binary) {
    local_99 = useHexString(this);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_99 == false) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
    for (local_50 = 0; uVar3 = (ulong)local_50, uVar4 = std::__cxx11::string::length(),
        uVar3 < uVar4; local_50 = local_50 + 1) {
      pbVar2 = (byte *)std::__cxx11::string::at((ulong)this);
      local_51 = *pbVar2;
      if (local_51 == 8) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
      }
      else if (local_51 == 9) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
      }
      else if (local_51 == 10) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
      }
      else if (local_51 == 0xc) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
      }
      else if (local_51 == 0xd) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
      }
      else if (local_51 == 0x28) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\(");
      }
      else if (local_51 == 0x29) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\)");
      }
      else if (local_51 == 0x5c) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
      }
      else {
        bVar1 = is_iso_latin1_printable(local_51);
        if (bVar1) {
          pcVar5 = (char *)std::__cxx11::string::at((ulong)this);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar5);
        }
        else {
          QUtil::int_to_string_base_abi_cxx11_(&local_98,(QUtil *)(ulong)local_51,8,3,in_R8D);
          std::operator+(&local_78,"\\",&local_98);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
        }
      }
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'<');
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _i = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&i), bVar1) {
      pbVar2 = (byte *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end2);
      ch = *pbVar2;
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"0123456789abcdef"[(byte)ch >> 4]);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"0123456789abcdef"[(byte)ch & 0xf]);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'>');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF_String::unparse(bool force_binary)
{
    bool use_hexstring = force_binary || useHexString();
    std::string result;
    if (use_hexstring) {
        static auto constexpr hexchars = "0123456789abcdef";
        result.reserve(2 * this->val.length() + 2);
        result += '<';
        for (const char c: this->val) {
            result += hexchars[static_cast<unsigned char>(c) >> 4];
            result += hexchars[c & 0x0f];
        }
        result += '>';
    } else {
        result += "(";
        for (unsigned int i = 0; i < this->val.length(); ++i) {
            char ch = this->val.at(i);
            switch (ch) {
            case '\n':
                result += "\\n";
                break;

            case '\r':
                result += "\\r";
                break;

            case '\t':
                result += "\\t";
                break;

            case '\b':
                result += "\\b";
                break;

            case '\f':
                result += "\\f";
                break;

            case '(':
                result += "\\(";
                break;

            case ')':
                result += "\\)";
                break;

            case '\\':
                result += "\\\\";
                break;

            default:
                if (is_iso_latin1_printable(ch)) {
                    result += this->val.at(i);
                } else {
                    result += "\\" +
                        QUtil::int_to_string_base(
                                  static_cast<int>(static_cast<unsigned char>(ch)), 8, 3);
                }
                break;
            }
        }
        result += ")";
    }

    return result;
}